

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O0

aiString * ReadString(aiString *__return_storage_ptr__,StreamReaderLE *stream,uint32_t numWChars)

{
  unsigned_short *end_00;
  unsigned_short *start_00;
  uint16_t uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  allocator local_99;
  string local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_70;
  unsigned_short *local_68;
  uint16_t *end;
  uint16_t *start;
  unsigned_short *puStack_50;
  uint32_t n;
  uint16_t *temp;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> str;
  uint32_t numWChars_local;
  StreamReaderLE *stream_local;
  aiString *result;
  
  str.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = numWChars;
  if ((stream == (StreamReaderLE *)0x0) || (numWChars == 0)) {
    if (ReadString(Assimp::StreamReader<false,false>*,unsigned_int)::empty == '\0') {
      iVar2 = __cxa_guard_acquire(&ReadString(Assimp::StreamReader<false,false>*,unsigned_int)::
                                   empty);
      if (iVar2 != 0) {
        aiString::aiString(&ReadString::empty);
        __cxa_guard_release(&ReadString(Assimp::StreamReader<false,false>*,unsigned_int)::empty);
      }
    }
    aiString::aiString(__return_storage_ptr__,&ReadString::empty);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
               (ulong)(str.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage._4_4_ * 4 + 1));
    puStack_50 = (unsigned_short *)
                 operator_new__((ulong)str.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 2)
    ;
    for (start._4_4_ = 0; start_00 = puStack_50,
        start._4_4_ <
        str.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_; start._4_4_ = start._4_4_ + 1) {
      uVar1 = Assimp::StreamReader<false,_false>::GetU2(stream);
      puStack_50[start._4_4_] = uVar1;
    }
    end = puStack_50;
    end_00 = puStack_50 +
             str.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_;
    local_68 = end_00;
    local_70 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    local_78 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               utf8::
               utf16to8<unsigned_short_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                         (start_00,end_00,
                          (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )local_70);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,sVar3 - 1)
    ;
    *pvVar4 = '\0';
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,(char *)pvVar4,&local_99);
    aiString::aiString(__return_storage_ptr__,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    if (puStack_50 != (unsigned_short *)0x0) {
      operator_delete__(puStack_50);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

static aiString ReadString(StreamReaderLE *stream, uint32_t numWChars) {
    if ( nullptr == stream || 0 == numWChars ) {
        static const aiString empty;
        return empty;
    }

    // Allocate buffers (max expansion is 1 byte -> 4 bytes for UTF-8)
    std::vector<unsigned char> str;
    str.reserve( numWChars * 4 + 1 );
    uint16_t *temp = new uint16_t[ numWChars ];
    for ( uint32_t n = 0; n < numWChars; ++n ) {
        temp[ n ] = stream->GetU2();
    }

    // Convert it and NUL-terminate.
    const uint16_t *start( temp ), *end( temp + numWChars );
    utf8::utf16to8( start, end, back_inserter( str ) );
    str[ str.size() - 1 ] = '\0';

    // Return the final string.
    aiString result = aiString((const char *)&str[0]);
    delete[] temp;

    return result;
}